

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeGuard.h
# Opt level: O0

void __thiscall
idx2::
scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Decode.cpp:334:3)>
::~scope_guard(scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:334:3)>
               *this)

{
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Decode_cpp:334:3)>
  *this_local;
  
  if ((this->Dismissed & 1U) == 0) {
    anon_class_16_2_ad7260ec_for_Func::operator()(&this->Func);
  }
  return;
}

Assistant:

~scope_guard()
  {
    if (!Dismissed)
    {
      Func();
    }
  }